

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

string * __thiscall
duckdb::Exception::ConstructMessage<unsigned_long,std::__cxx11::string,char*>
          (string *__return_storage_ptr__,Exception *this,string *msg,unsigned_long params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,char *params_2
          )

{
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  _Alloc_hider params_1_00;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  params_1_00._M_p = (char *)0x0;
  local_48[0] = local_38;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,*(long *)params,*(long *)(params + 8) + *(long *)params);
  ConstructMessageRecursive<unsigned_long,std::__cxx11::string,char*>
            (__return_storage_ptr__,this,(string *)&stack0xffffffffffffff98,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,(unsigned_long)local_48,params_1,params_1_00._M_p);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
          &stack0xffffffffffffff98);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}